

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flagser.h
# Opt level: O0

filtered_directed_graph_t * read_graph_flagser(string *filename,flagser_parameters *params)

{
  vector<float,_std::allocator<float>_> *this;
  byte bVar1;
  bool bVar2;
  long lVar3;
  char *pcVar4;
  reference pvVar5;
  reference pvVar6;
  runtime_error *this_00;
  string *in_RSI;
  ulong uVar7;
  filtered_directed_graph_t *in_RDI;
  string err_msg;
  vector<float,_std::allocator<float>_> vertices_1;
  vector<unsigned_short,_std::allocator<unsigned_short>_> vertices;
  char *iter;
  iterator __end4;
  iterator __begin4;
  string *__range4;
  int number_of_spaces;
  ifstream input_stream;
  HAS_EDGE_FILTRATION has_edge_filtration;
  vector<float,_std::allocator<float>_> vertex_filtration;
  int current_dimension;
  string line;
  filtered_directed_graph_t *graph;
  filtered_directed_graph_t *in_stack_fffffffffffff8f8;
  float __val;
  int in_stack_fffffffffffff900;
  int in_stack_fffffffffffff904;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff908;
  undefined4 in_stack_fffffffffffff910;
  value_type in_stack_fffffffffffff914;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff930;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff938;
  filtered_directed_graph_t *in_stack_fffffffffffff940;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffff948;
  undefined4 in_stack_fffffffffffff950;
  uint in_stack_fffffffffffff954;
  string *in_stack_fffffffffffff978;
  string local_658 [32];
  string local_638 [32];
  string local_618 [28];
  vertex_index_t in_stack_fffffffffffffa04;
  vertex_index_t in_stack_fffffffffffffa06;
  directed_graph_t *in_stack_fffffffffffffa08;
  string local_5d8 [32];
  string local_5b8 [32];
  string local_598 [32];
  string local_578 [32];
  string local_558 [32];
  string local_538 [32];
  string local_518 [32];
  string local_4f8 [16];
  function<float_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  *in_stack_fffffffffffffb18;
  char in_stack_fffffffffffffb27;
  string *in_stack_fffffffffffffb28;
  string local_4b8 [32];
  string local_498 [32];
  undefined1 local_478 [88];
  vector<float,_std::allocator<float>_> local_420;
  pointer local_408;
  pointer local_400;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3f8;
  string *local_3f0;
  int local_3e4;
  string local_2b8 [32];
  string local_298 [32];
  istream local_278 [524];
  int local_6c;
  vector<float,_std::allocator<float>_> local_68;
  int local_50;
  byte local_39;
  string local_38 [56];
  
  std::__cxx11::string::string(local_38);
  local_39 = 0;
  filtered_directed_graph_t::filtered_directed_graph_t
            ((filtered_directed_graph_t *)
             CONCAT44(in_stack_fffffffffffff904,in_stack_fffffffffffff900));
  local_50 = 0;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)0x147f36);
  local_6c = 0;
  std::ifstream::ifstream(local_278);
  std::__cxx11::string::string(local_298,in_RSI);
  open_file((string *)in_stack_fffffffffffff940,(ifstream *)in_stack_fffffffffffff938);
  std::__cxx11::string::~string(local_298);
  while( true ) {
    while( true ) {
      while( true ) {
        while( true ) {
          do {
            bVar1 = std::ios::eof();
            if (((bVar1 ^ 0xff) & 1) == 0) {
              local_39 = 1;
              std::ifstream::~ifstream(local_278);
              std::vector<float,_std::allocator<float>_>::~vector
                        ((vector<float,_std::allocator<float>_> *)
                         CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910));
              if ((local_39 & 1) == 0) {
                filtered_directed_graph_t::~filtered_directed_graph_t
                          ((filtered_directed_graph_t *)
                           CONCAT44(in_stack_fffffffffffff904,in_stack_fffffffffffff900));
              }
              std::__cxx11::string::~string(local_38);
              return in_RDI;
            }
            std::getline<char,std::char_traits<char>,std::allocator<char>>(local_278,local_38);
            trim(in_stack_fffffffffffff978);
            std::__cxx11::string::operator=(local_38,local_2b8);
            std::__cxx11::string::~string(local_2b8);
            lVar3 = std::__cxx11::string::length();
          } while (lVar3 == 0);
          pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
          if (((*pcVar4 != 'd') ||
              (in_stack_fffffffffffff978 =
                    (string *)std::__cxx11::string::operator[]((ulong)local_38),
              in_stack_fffffffffffff978->_M_dataplus != (_Alloc_hider)0x69)) ||
             (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_38), *pcVar4 != 'm'))
          break;
          pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
          if (*pcVar4 == '1') {
            std::vector<float,_std::allocator<float>_>::vector
                      ((vector<float,_std::allocator<float>_> *)
                       CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950),
                       in_stack_fffffffffffff948);
            filtered_directed_graph_t::filtered_directed_graph_t
                      (in_stack_fffffffffffff940,
                       (vector<float,_std::allocator<float>_> *)in_stack_fffffffffffff938,
                       SUB81((ulong)in_stack_fffffffffffff930 >> 0x38,0));
            filtered_directed_graph_t::operator=
                      ((filtered_directed_graph_t *)
                       CONCAT44(in_stack_fffffffffffff904,in_stack_fffffffffffff900),
                       in_stack_fffffffffffff8f8);
            filtered_directed_graph_t::~filtered_directed_graph_t
                      ((filtered_directed_graph_t *)
                       CONCAT44(in_stack_fffffffffffff904,in_stack_fffffffffffff900));
            std::vector<float,_std::allocator<float>_>::~vector
                      ((vector<float,_std::allocator<float>_> *)
                       CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910));
            local_50 = 1;
            local_6c = 1;
          }
        }
        if (local_50 != 0) break;
        bVar2 = std::vector<float,_std::allocator<float>_>::empty
                          ((vector<float,_std::allocator<float>_> *)
                           CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910));
        if (bVar2) {
          std::function<float(std::__cxx11::string)>::function<float(&)(std::__cxx11::string),void>
                    ((function<float_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                      *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910),
                     (_func_float_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                      *)in_stack_fffffffffffff908);
          split<float>(in_stack_fffffffffffffb28,in_stack_fffffffffffffb27,in_stack_fffffffffffffb18
                      );
          std::vector<float,_std::allocator<float>_>::operator=
                    ((vector<float,_std::allocator<float>_> *)
                     CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910),
                     (vector<float,_std::allocator<float>_> *)in_stack_fffffffffffff908);
          std::vector<float,_std::allocator<float>_>::~vector
                    ((vector<float,_std::allocator<float>_> *)
                     CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910));
          std::
          function<float_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
          ::~function((function<float_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                       *)0x148287);
        }
      }
      if (local_6c == 1) {
        local_3e4 = 0;
        local_3f0 = local_38;
        local_3f8._M_current = (char *)std::__cxx11::string::begin();
        local_400 = (pointer)std::__cxx11::string::end();
        while (bVar2 = __gnu_cxx::operator!=
                                 ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)CONCAT44(in_stack_fffffffffffff904,in_stack_fffffffffffff900),
                                  (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)in_stack_fffffffffffff8f8), bVar2) {
          local_408 = (pointer)__gnu_cxx::
                               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               ::operator*(&local_3f8);
          if ((char)*local_408 == ' ') {
            local_3e4 = local_3e4 + 1;
          }
          __gnu_cxx::
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator++(&local_3f8);
        }
        local_6c = 2;
        if (local_3e4 == 1) {
          local_6c = 3;
        }
      }
      if (local_6c != 3) break;
      std::function<unsigned_short(std::__cxx11::string)>::
      function<unsigned_int(&)(std::__cxx11::string),void>
                ((function<unsigned_short_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                  *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910),
                 (_func_uint_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff908);
      split<unsigned_short>
                (in_stack_fffffffffffffb28,in_stack_fffffffffffffb27,
                 (function<unsigned_short_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                  *)in_stack_fffffffffffffb18);
      std::
      function<unsigned_short_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
      ::~function((function<unsigned_short_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                   *)0x1483dc);
      in_stack_fffffffffffff948 = &local_420;
      pvVar5 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                         ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                          in_stack_fffffffffffff948,0);
      in_stack_fffffffffffff954 = (uint)*pvVar5;
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                 in_stack_fffffffffffff948,1);
      directed_graph_t::add_edge
                (in_stack_fffffffffffffa08,in_stack_fffffffffffffa06,in_stack_fffffffffffffa04);
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
                ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                 CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910));
    }
    in_stack_fffffffffffff940 = (filtered_directed_graph_t *)local_478;
    std::function<float(std::__cxx11::string)>::function<float(&)(std::__cxx11::string),void>
              ((function<float_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910),
               (_func_float_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff908);
    __val = (float)((ulong)in_stack_fffffffffffff8f8 >> 0x20);
    split<float>(in_stack_fffffffffffffb28,in_stack_fffffffffffffb27,in_stack_fffffffffffffb18);
    std::
    function<float_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
    ::~function((function<float_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                 *)0x1484c3);
    this = (vector<float,_std::allocator<float>_> *)(local_478 + 0x20);
    pvVar6 = std::vector<float,_std::allocator<float>_>::operator[](this,2);
    in_stack_fffffffffffff914 = *pvVar6;
    pvVar6 = std::vector<float,_std::allocator<float>_>::operator[](this,0);
    uVar7 = (ulong)*pvVar6;
    in_stack_fffffffffffff930 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::vector<float,_std::allocator<float>_>::operator[]
                   (&local_68,uVar7 | (long)(*pvVar6 - 9.223372e+18) & (long)uVar7 >> 0x3f);
    pvVar6 = std::vector<float,_std::allocator<float>_>::operator[](this,1);
    uVar7 = (ulong)*pvVar6;
    pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                       (&local_68,uVar7 | (long)(*pvVar6 - 9.223372e+18) & (long)uVar7 >> 0x3f);
    in_stack_fffffffffffff938 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::max<float>((float *)in_stack_fffffffffffff930,pvVar6);
    if (in_stack_fffffffffffff914 < *(float *)in_stack_fffffffffffff938) break;
    in_stack_fffffffffffff8f8 = (filtered_directed_graph_t *)(local_478 + 0x20);
    pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffff8f8,0);
    in_stack_fffffffffffff900 = (int)*pvVar6;
    pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffff8f8,1);
    in_stack_fffffffffffff904 = (int)*pvVar6;
    std::vector<float,_std::allocator<float>_>::operator[]
              ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffff8f8,2);
    filtered_directed_graph_t::add_filtered_edge
              ((filtered_directed_graph_t *)
               CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910),
               (vertex_index_t)((ulong)in_stack_fffffffffffff908 >> 0x30),
               (vertex_index_t)((ulong)in_stack_fffffffffffff908 >> 0x20),
               SUB84(in_stack_fffffffffffff908,0));
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)
               CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910));
  }
  std::vector<float,_std::allocator<float>_>::operator[]
            ((vector<float,_std::allocator<float>_> *)(local_478 + 0x20),0);
  std::__cxx11::to_string(__val);
  std::operator+((char *)in_stack_fffffffffffff908,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff904,in_stack_fffffffffffff900));
  std::operator+(in_stack_fffffffffffff908,
                 (char *)CONCAT44(in_stack_fffffffffffff904,in_stack_fffffffffffff900));
  std::vector<float,_std::allocator<float>_>::operator[]
            ((vector<float,_std::allocator<float>_> *)(local_478 + 0x20),1);
  std::__cxx11::to_string(__val);
  std::operator+(in_stack_fffffffffffff938,in_stack_fffffffffffff930);
  std::operator+(in_stack_fffffffffffff908,
                 (char *)CONCAT44(in_stack_fffffffffffff904,in_stack_fffffffffffff900));
  std::vector<float,_std::allocator<float>_>::operator[]
            ((vector<float,_std::allocator<float>_> *)(local_478 + 0x20),2);
  std::__cxx11::to_string(__val);
  std::operator+(in_stack_fffffffffffff938,in_stack_fffffffffffff930);
  std::operator+(in_stack_fffffffffffff908,
                 (char *)CONCAT44(in_stack_fffffffffffff904,in_stack_fffffffffffff900));
  pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)(local_478 + 0x20),0);
  uVar7 = (ulong)*pvVar6;
  std::vector<float,_std::allocator<float>_>::operator[]
            (&local_68,uVar7 | (long)(*pvVar6 - 9.223372e+18) & (long)uVar7 >> 0x3f);
  std::__cxx11::to_string(__val);
  std::operator+(in_stack_fffffffffffff938,in_stack_fffffffffffff930);
  std::operator+(in_stack_fffffffffffff908,
                 (char *)CONCAT44(in_stack_fffffffffffff904,in_stack_fffffffffffff900));
  pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)(local_478 + 0x20),1);
  uVar7 = (ulong)*pvVar6;
  std::vector<float,_std::allocator<float>_>::operator[]
            (&local_68,uVar7 | (long)(*pvVar6 - 9.223372e+18) & (long)uVar7 >> 0x3f);
  std::__cxx11::to_string(__val);
  std::operator+(in_stack_fffffffffffff938,in_stack_fffffffffffff930);
  std::operator+(in_stack_fffffffffffff908,
                 (char *)CONCAT44(in_stack_fffffffffffff904,in_stack_fffffffffffff900));
  std::__cxx11::string::~string(local_4b8);
  std::__cxx11::string::~string(local_658);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffb28);
  std::__cxx11::string::~string(local_4f8);
  std::__cxx11::string::~string(local_638);
  std::__cxx11::string::~string(local_518);
  std::__cxx11::string::~string(local_538);
  std::__cxx11::string::~string(local_618);
  std::__cxx11::string::~string(local_558);
  std::__cxx11::string::~string(local_578);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffa08);
  std::__cxx11::string::~string(local_598);
  std::__cxx11::string::~string(local_5b8);
  std::__cxx11::string::~string(local_5d8);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,local_498);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

filtered_directed_graph_t read_graph_flagser(const std::string filename, const flagser_parameters& params) {
	std::string line;
	filtered_directed_graph_t graph{};
	int current_dimension = 0;
	std::vector<value_t> vertex_filtration;
	HAS_EDGE_FILTRATION has_edge_filtration = HAS_EDGE_FILTRATION::TOO_EARLY_TO_DECIDE;

	std::ifstream input_stream;
	open_file(filename, input_stream);

	while (not input_stream.eof()) {
		getline(input_stream, line);
		line = trim(line);
		if (line.length() == 0) continue;
		if (line[0] == 'd' && line[1] == 'i' && line[2] == 'm') {
			if (line[4] == '1') {
				graph = filtered_directed_graph_t(vertex_filtration, params.directed);
				current_dimension = 1;
				has_edge_filtration = HAS_EDGE_FILTRATION::MAYBE;
			}
			continue;
		}

		if (current_dimension == 0) {
			if (vertex_filtration.empty()) vertex_filtration = split<value_t>(line, ' ', string_to_float);
		} else {
			if (has_edge_filtration == HAS_EDGE_FILTRATION::MAYBE) {
				// If the edge has three components, then there are also filtration values, which we assume to come last
				int number_of_spaces = 0;
				for (auto& iter : line)
					if (iter == ' ') { number_of_spaces++; }
				has_edge_filtration = number_of_spaces == 1 ? HAS_EDGE_FILTRATION::NO : HAS_EDGE_FILTRATION::YES;
			}

			if (has_edge_filtration == NO) {
				std::vector<vertex_index_t> vertices = split<vertex_index_t>(line, ' ', string_to_uint);
				graph.add_edge(vertices[0], vertices[1]);
			} else {
				std::vector<value_t> vertices = split<value_t>(line, ' ', string_to_float);
				if (value_t(vertices[2]) <
				    std::max(vertex_filtration[size_t(vertices[0])], vertex_filtration[size_t(vertices[1])])) {
					std::string err_msg =
					    "The flagser file contained an edge filtration that contradicts the vertex "
					    "filtration, the edge (" +
					    std::to_string(vertices[0]) + ", " + std::to_string(vertices[1]) + ") has filtration value " +
					    std::to_string(vertices[2]) + ", which is lower than min(" +
					    std::to_string(vertex_filtration[size_t(vertices[0])]) + ", " +
					    std::to_string(vertex_filtration[size_t(vertices[1])]) + "), the filtrations of its vertices.";
					throw std::runtime_error(err_msg);
				}
				graph.add_filtered_edge((vertex_index_t)vertices[0], (vertex_index_t)vertices[1], vertices[2]);
			}
		}
	}

	return graph;
}